

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall cmInstallExportGenerator::GenerateScript(cmInstallExportGenerator *this,ostream *os)

{
  string *psVar1;
  cmExportInstallFileGenerator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer pbVar3;
  ostream *poVar4;
  const_iterator __begin2;
  pointer config;
  ostringstream e;
  string local_1c0;
  string local_1a0 [11];
  
  if ((this->ExportSet->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->ExportSet->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar4 = std::operator<<((ostream *)local_1a0,"INSTALL(EXPORT) given unknown export \"");
    poVar4 = std::operator<<(poVar4,(string *)&this->ExportSet->Name);
    std::operator<<(poVar4,"\"");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  else {
    ComputeTempDir(this);
    cmsys::SystemTools::MakeDirectory(&this->TempDir,(mode_t *)0x0);
    psVar1 = &this->MainImportFile;
    std::__cxx11::string::_M_assign((string *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((string *)psVar1);
    cmExportFileGenerator::SetExportFile
              (&this->EFGen->super_cmExportFileGenerator,(this->MainImportFile)._M_dataplus._M_p);
    std::__cxx11::string::_M_assign((string *)&(this->EFGen->super_cmExportFileGenerator).Namespace)
    ;
    this_00 = this->EFGen;
    (this_00->super_cmExportFileGenerator).ExportOld = this->ExportOld;
    pvVar2 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes;
    config = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (pvVar2->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (config == pbVar3) {
      if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName.
          _M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a0,"",(allocator<char> *)&local_1c0);
        cmExportFileGenerator::AddConfiguration(&this_00->super_cmExportFileGenerator,local_1a0);
        std::__cxx11::string::~string((string *)local_1a0);
      }
      else {
        cmExportFileGenerator::AddConfiguration
                  (&this_00->super_cmExportFileGenerator,
                   &(this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName);
      }
    }
    else {
      for (; config != pbVar3; config = config + 1) {
        cmExportFileGenerator::AddConfiguration(&this->EFGen->super_cmExportFileGenerator,config);
      }
    }
    cmExportFileGenerator::GenerateImportFile(&this->EFGen->super_cmExportFileGenerator);
    cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,os);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScript(std::ostream& os)
{
  // Skip empty sets.
  if (ExportSet->GetTargetExports()->empty()) {
    std::ostringstream e;
    e << "INSTALL(EXPORT) given unknown export \"" << ExportSet->GetName()
      << "\"";
    cmSystemTools::Error(e.str());
    return;
  }

  // Create the temporary directory in which to store the files.
  this->ComputeTempDir();
  cmSystemTools::MakeDirectory(this->TempDir);

  // Construct a temporary location for the file.
  this->MainImportFile = this->TempDir;
  this->MainImportFile += "/";
  this->MainImportFile += this->FileName;

  // Generate the import file for this export set.
  this->EFGen->SetExportFile(this->MainImportFile.c_str());
  this->EFGen->SetNamespace(this->Namespace);
  this->EFGen->SetExportOld(this->ExportOld);
  if (this->ConfigurationTypes->empty()) {
    if (!this->ConfigurationName.empty()) {
      this->EFGen->AddConfiguration(this->ConfigurationName);
    } else {
      this->EFGen->AddConfiguration("");
    }
  } else {
    for (std::string const& c : *this->ConfigurationTypes) {
      this->EFGen->AddConfiguration(c);
    }
  }
  this->EFGen->GenerateImportFile();

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}